

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int recvMax(int pi,void *buf,int bufsize,int sent)

{
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  int in_EDI;
  int count;
  int fetch;
  int remaining;
  uint8_t scratch [4096];
  int local_1024;
  uint local_1020;
  uint local_101c;
  undefined1 local_1018 [4096];
  int local_18;
  int local_4;
  
  local_1024 = in_EDX;
  if (in_ECX < in_EDX) {
    local_1024 = in_ECX;
  }
  local_18 = in_ECX;
  local_4 = in_EDI;
  if (local_1024 != 0) {
    recv(gPigCommand[in_EDI],in_RSI,(long)local_1024,0x100);
  }
  for (local_101c = local_18 - local_1024; local_101c != 0; local_101c = local_101c - local_1020) {
    local_1020 = local_101c;
    if (0x1000 < local_101c) {
      local_1020 = 0x1000;
    }
    recv(gPigCommand[local_4],local_1018,(long)(int)local_1020,0x100);
  }
  return local_1024;
}

Assistant:

static int recvMax(int pi, void *buf, int bufsize, int sent)
{
   /*
   Copy at most bufSize bytes from the receieved message to
   buf.  Discard the rest of the message.
   */
   uint8_t scratch[4096];
   int remaining, fetch, count;

   if (sent < bufsize) count = sent; else count = bufsize;

   if (count) recv(gPigCommand[pi], buf, count, MSG_WAITALL);

   remaining = sent - count;

   while (remaining)
   {
      fetch = remaining;
      if (fetch > sizeof(scratch)) fetch = sizeof(scratch);
      recv(gPigCommand[pi], scratch, fetch, MSG_WAITALL);
      remaining -= fetch;
   }

   return count;
}